

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int io_readline(lua_State *L)

{
  GCObject *pGVar1;
  FILE *__stream;
  StkId pTVar2;
  StkId pTVar3;
  StkId pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int *piVar10;
  char *pcVar11;
  TValue *pTVar12;
  long lVar13;
  ulong uVar14;
  StkId pTVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pGVar1 = (L->ci->func->value).gc;
  pTVar12 = (TValue *)&(pGVar1->h).lastfree;
  if ((pGVar1->h).lsizenode == '\0') {
    pTVar12 = &luaO_nilobject_;
  }
  lVar13 = 0x28;
  if (pTVar12->tt != 7) {
    lVar13 = 0;
  }
  __stream = *(FILE **)((long)(pTVar12->value).gc + lVar13);
  if (__stream == (FILE *)0x0) {
    luaL_error(L,"file is already closed");
  }
  iVar8 = read_line(L,(FILE *)__stream);
  iVar9 = ferror(__stream);
  auVar7 = _DAT_00115030;
  auVar6 = _DAT_00115020;
  auVar5 = _DAT_00115010;
  if (iVar9 != 0) {
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    luaL_error(L,"%s",pcVar11);
  }
  iVar9 = 1;
  if (iVar8 == 0) {
    pTVar2 = L->ci->func;
    pGVar1 = (pTVar2->value).gc;
    pTVar12 = (TValue *)&(pGVar1->h).sizearray;
    if ((pGVar1->h).lsizenode < 2) {
      pTVar12 = &luaO_nilobject_;
    }
    iVar9 = pTVar12->tt;
    if (iVar9 != 0) {
      if ((iVar9 != 1) || ((pTVar12->value).b != 0)) {
        pTVar3 = L->top;
        pTVar4 = L->base;
        if (pTVar3 < pTVar4) {
          pTVar15 = pTVar3 + 1;
          if (pTVar3 + 1 < pTVar4) {
            pTVar15 = pTVar4;
          }
          uVar14 = (long)&pTVar15->value + ~(ulong)pTVar3;
          auVar19._8_4_ = (int)uVar14;
          auVar19._0_8_ = uVar14;
          auVar19._12_4_ = (int)(uVar14 >> 0x20);
          auVar17._0_8_ = uVar14 >> 4;
          auVar17._8_8_ = auVar19._8_8_ >> 4;
          piVar10 = &pTVar3[3].tt;
          uVar16 = 0;
          auVar17 = auVar17 ^ _DAT_00115030;
          do {
            auVar18._8_4_ = (int)uVar16;
            auVar18._0_8_ = uVar16;
            auVar18._12_4_ = (int)(uVar16 >> 0x20);
            auVar19 = (auVar18 | auVar6) ^ auVar7;
            iVar8 = auVar17._4_4_;
            if ((bool)(~(auVar19._4_4_ == iVar8 && auVar17._0_4_ < auVar19._0_4_ ||
                        iVar8 < auVar19._4_4_) & 1)) {
              piVar10[-0xc] = 0;
            }
            if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
                auVar19._12_4_ <= auVar17._12_4_) {
              piVar10[-8] = 0;
            }
            auVar19 = (auVar18 | auVar5) ^ auVar7;
            iVar9 = auVar19._4_4_;
            if (iVar9 <= iVar8 && (iVar9 != iVar8 || auVar19._0_4_ <= auVar17._0_4_)) {
              piVar10[-4] = 0;
              *piVar10 = 0;
            }
            uVar16 = uVar16 + 4;
            piVar10 = piVar10 + 0x10;
          } while (((uVar14 >> 4) + 4 & 0xfffffffffffffffc) != uVar16);
        }
        L->top = pTVar4;
        pGVar1 = (pTVar2->value).gc;
        pTVar12 = (TValue *)&(pGVar1->h).lastfree;
        if ((pGVar1->h).lsizenode == '\0') {
          pTVar12 = &luaO_nilobject_;
        }
        pTVar4->value = pTVar12->value;
        pTVar4->tt = ((Value *)((long)pTVar12 + 8))->b;
        L->top = L->top + 1;
        aux_close(L);
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int io_readline(lua_State*L){
FILE*f=*(FILE**)lua_touserdata(L,lua_upvalueindex(1));
int sucess;
if(f==NULL)
luaL_error(L,"file is already closed");
sucess=read_line(L,f);
if(ferror(f))
return luaL_error(L,"%s",strerror(errno));
if(sucess)return 1;
else{
if(lua_toboolean(L,lua_upvalueindex(2))){
lua_settop(L,0);
lua_pushvalue(L,lua_upvalueindex(1));
aux_close(L);
}
return 0;
}
}